

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covBuild.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkCovDeriveClean(Cov_Man_t *p,Abc_Ntk_t *pNtk)

{
  long *plVar1;
  int iVar2;
  Abc_Ntk_t *pNtkNew;
  Vec_Ptr_t *pVVar3;
  Abc_Obj_t *pFanin;
  long lVar4;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    pNtkNew = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_SOP);
    pVVar3 = pNtk->vCos;
    if (0 < pVVar3->nSize) {
      lVar4 = 0;
      do {
        plVar1 = (long *)pVVar3->pArray[lVar4];
        pFanin = Abc_NtkCovDeriveNodeInv_rec
                           (p,pNtkNew,
                            *(Abc_Obj_t **)
                             (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8
                             ),*(uint *)((long)plVar1 + 0x14) >> 10 & 1);
        Abc_ObjAddFanin((Abc_Obj_t *)plVar1[8],pFanin);
        lVar4 = lVar4 + 1;
        pVVar3 = pNtk->vCos;
      } while (lVar4 < pVVar3->nSize);
    }
    Abc_NtkLogicMakeSimpleCos(pNtkNew,0);
    iVar2 = Abc_NtkCheck(pNtkNew);
    if (iVar2 == 0) {
      puts("Abc_NtkCovDeriveInv: The network check has failed.");
      Abc_NtkDelete(pNtkNew);
      pNtkNew = (Abc_Ntk_t *)0x0;
    }
    return pNtkNew;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/cov/covBuild.c"
                ,0x16a,"Abc_Ntk_t *Abc_NtkCovDeriveClean(Cov_Man_t *, Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkCovDeriveClean( Cov_Man_t * p, Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pNodeNew;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    // perform strashing
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    // reconstruct the network
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pNodeNew = Abc_NtkCovDeriveNodeInv_rec( p, pNtkNew, Abc_ObjFanin0(pObj), Abc_ObjFaninC0(pObj) );
        Abc_ObjAddFanin( pObj->pCopy, pNodeNew );
    }
    // add the COs
    Abc_NtkLogicMakeSimpleCos( pNtkNew, 0 );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkCovDeriveInv: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}